

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::TypedExpectation<ot::commissioner::Error_(ot::commissioner::Timestamp_&)>::
Matches(TypedExpectation<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *this,
       ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<ot::commissioner::Timestamp&>>,std::tuple<ot::commissioner::Timestamp&>>
                    ((tuple<testing::Matcher<ot::commissioner::Timestamp_&>_> *)(this + 0xf0),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<ot::commissioner::Timestamp_&>_&>::Matches
                         ((MatcherBase<const_std::tuple<ot::commissioner::Timestamp_&>_&> *)
                          (this + 0x108),args);
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }